

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tool_getparam.c
# Opt level: O0

ParameterError parse_ech(GlobalConfig *global,OperationConfig *config,char *nextarg)

{
  int iVar1;
  size_t sVar2;
  undefined8 uVar3;
  FILE *local_40;
  FILE *file;
  char *tmpcfg;
  char *pcStack_28;
  ParameterError err;
  char *nextarg_local;
  OperationConfig *config_local;
  GlobalConfig *global_local;
  
  tmpcfg._4_4_ = 0;
  if (feature_ech) {
    pcStack_28 = nextarg;
    nextarg_local = (char *)config;
    config_local = (OperationConfig *)global;
    sVar2 = strlen(nextarg);
    if ((sVar2 < 5) || (iVar1 = curl_strnequal("pn:",pcStack_28,3), iVar1 == 0)) {
      sVar2 = strlen(pcStack_28);
      if ((sVar2 < 6) || (iVar1 = curl_strnequal("ecl:",pcStack_28,4), iVar1 == 0)) {
        tmpcfg._4_4_ = getstr((char **)(nextarg_local + 0x390),pcStack_28,false);
      }
      else if (pcStack_28[4] == '@') {
        file = (FILE *)0x0;
        pcStack_28 = pcStack_28 + 5;
        iVar1 = strcmp("-",pcStack_28);
        if (iVar1 == 0) {
          local_40 = _stdin;
        }
        else {
          local_40 = fopen64(pcStack_28,"r");
        }
        if (local_40 == (FILE *)0x0) {
          warnf((GlobalConfig *)config_local,
                "Couldn\'t read file \"%s\" specified for \"--ech ecl:\" option",pcStack_28);
          return PARAM_BAD_USE;
        }
        tmpcfg._4_4_ = file2string((char **)&file,(FILE *)local_40);
        if (local_40 != _stdin) {
          fclose(local_40);
        }
        if (tmpcfg._4_4_ != PARAM_OK) {
          return tmpcfg._4_4_;
        }
        uVar3 = curl_maprintf("ecl:%s",file);
        *(undefined8 *)(nextarg_local + 0x398) = uVar3;
        free(file);
        if (*(long *)(nextarg_local + 0x398) == 0) {
          return PARAM_NO_MEM;
        }
      }
      else {
        tmpcfg._4_4_ = getstr((char **)(nextarg_local + 0x398),pcStack_28,false);
      }
    }
    else {
      tmpcfg._4_4_ = getstr((char **)(nextarg_local + 0x3a0),pcStack_28,false);
    }
  }
  else {
    tmpcfg._4_4_ = PARAM_LIBCURL_DOESNT_SUPPORT;
  }
  return tmpcfg._4_4_;
}

Assistant:

static ParameterError parse_ech(struct GlobalConfig *global,
                                struct OperationConfig *config,
                                const char *nextarg)
{
  ParameterError err = PARAM_OK;
  if(!feature_ech)
    err = PARAM_LIBCURL_DOESNT_SUPPORT;
  else if(strlen(nextarg) > 4 && strncasecompare("pn:", nextarg, 3)) {
    /* a public_name */
    err = getstr(&config->ech_public, nextarg, DENY_BLANK);
  }
  else if(strlen(nextarg) > 5 && strncasecompare("ecl:", nextarg, 4)) {
    /* an ECHConfigList */
    if('@' != *(nextarg + 4)) {
      err = getstr(&config->ech_config, nextarg, DENY_BLANK);
    }
    else {
      /* Indirect case: @filename or @- for stdin */
      char *tmpcfg = NULL;
      FILE *file;

      nextarg += 5;        /* skip over 'ecl:@' */
      if(!strcmp("-", nextarg)) {
        file = stdin;
      }
      else {
        file = fopen(nextarg, FOPEN_READTEXT);
      }
      if(!file) {
        warnf(global,
              "Couldn't read file \"%s\" "
              "specified for \"--ech ecl:\" option",
              nextarg);
        return PARAM_BAD_USE; /*  */
      }
      err = file2string(&tmpcfg, file);
      if(file != stdin)
        fclose(file);
      if(err)
        return err;
      config->ech_config = aprintf("ecl:%s",tmpcfg);
      free(tmpcfg);
      if(!config->ech_config)
        return PARAM_NO_MEM;
    } /* file done */
  }
  else {
    /* Simple case: just a string, with a keyword */
    err = getstr(&config->ech, nextarg, DENY_BLANK);
  }
  return err;
}